

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O1

void anon_unknown.dwarf_9824::toc(char *txt)

{
  size_t sVar1;
  ostream *poVar2;
  double dVar3;
  
  (anonymous_namespace)::g_timer._8_8_ = std::chrono::_V2::system_clock::now();
  dVar3 = (double)(long)((anonymous_namespace)::g_timer._8_8_ - (anonymous_namespace)::g_timer._0_8_
                        ) / 1000000000.0;
  (anonymous_namespace)::g_timer._16_8_ = dVar3;
  if (txt == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1210f8);
  }
  else {
    sVar1 = strlen(txt);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,txt,sVar1);
  }
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds.\n",10);
  return;
}

Assistant:

void toc(const char* txt)
    {
    double ti = g_timer.time_elapsed();
    std::cout << txt << ti << " seconds.\n";
    }